

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AnyTests.cpp
# Opt level: O0

void __thiscall IsNotAnyTests::~IsNotAnyTests(IsNotAnyTests *this)

{
  IsNotAnyTests *this_local;
  
  ~IsNotAnyTests(this);
  operator_delete(this);
  return;
}

Assistant:

virtual void Run()
	{
		Then("Is::Not::Any<int>() when given an int is false", []() {

			int value(5);
			AssertThat(ut11::Is::Not::Any<int>()(value), ut11::Is::False);
		});

		Then("Is::Not::Any<int>() when given an implicitally castable type is false", []() {

			std::size_t value(5);
			AssertThat(ut11::Is::Not::Any<int>()(value), ut11::Is::False);
		});

		Then("Is::Not::Any<int>() when given a non-implicitally castable type is true", []() {

			std::string value("hkdskhkja");
			AssertThat(ut11::Is::Not::Any<int>()(value), ut11::Is::True);
		});

		Then("Is::Not::Any<Class>() when given the same class is false", []() {

			Class value;
			AssertThat(ut11::Is::Not::Any<Class>()(value), ut11::Is::False);
		});

		Then("Is::Not::Any<Class>() when given a different class is true", []() {

			DifferentClass value;
			AssertThat(ut11::Is::Not::Any<Class>()(value), ut11::Is::True);
		});

		Then("Is::Not::Any<Base>() when given a class that inherits from Base is false", []() {

			Derived value;
			AssertThat(ut11::Is::Not::Any<Base>()(value), ut11::Is::False);
		});

		Then("Is::Not::Any<Class>() is operand", []() {

			AssertThat(ut11::detail::IsOperand< decltype(ut11::Is::Not::Any<Class>()) >::value, ut11::Is::True);
		});

		Then("Is::Not::Any<Class> has an error message", []() {

			Derived value;
			AssertThat(ut11::Is::Not::Any<Class>().GetErrorMessage(value), ut11::Is::Not::EqualTo(""));
		});
	}